

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O3

share_forwarding * share_add_forwarding(ssh_sharing_connstate *cs,char *host,int port)

{
  share_forwarding *e;
  char *pcVar1;
  share_forwarding *psVar2;
  
  e = (share_forwarding *)safemalloc(1,0x18,0);
  pcVar1 = dupstr(host);
  e->host = pcVar1;
  e->port = port;
  e->active = false;
  psVar2 = (share_forwarding *)add234(cs->forwardings,e);
  if (psVar2 != e) {
    safefree(e);
    e = (share_forwarding *)0x0;
  }
  return e;
}

Assistant:

static struct share_forwarding *share_add_forwarding
    (struct ssh_sharing_connstate *cs,
     const char *host, int port)
{
    struct share_forwarding *fwd = snew(struct share_forwarding);
    fwd->host = dupstr(host);
    fwd->port = port;
    fwd->active = false;
    if (add234(cs->forwardings, fwd) != fwd) {
        /* Duplicate?! */
        sfree(fwd);
        return NULL;
    }
    return fwd;
}